

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMQ.cpp
# Opt level: O2

void __thiscall liblogger::LogMQ::Log(LogMQ *this,LogType Type,string *str)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  LogException *pLVar5;
  char *buf;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  buf = (char *)0x0;
  iVar1 = asprintf(&buf,"%d:%s",Type);
  if (buf == (char *)0x0) {
    pLVar5 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"LogMQ::Log Malloc Failed",(allocator<char> *)&local_1c0);
    LogException::LogException(pLVar5,(string *)&ss);
    __cxa_throw(pLVar5,&LogException::typeinfo,LogException::~LogException);
  }
  iVar1 = mq_send(this->m_id,buf,(long)iVar1,0);
  if (-1 < iVar1) {
    free(buf);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_190,"LogMQ::Log failed to write to queue: ");
  poVar2 = std::operator<<(poVar2,(string *)&this->m_QName);
  poVar2 = std::operator<<(poVar2,"\' error: ");
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::operator<<(poVar2,pcVar4);
  free(buf);
  pLVar5 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(pLVar5,&local_1c0);
  __cxa_throw(pLVar5,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogMQ::Log(const LogType Type, const std::string &str) {
	char *buf = 0;
	int len = asprintf(&buf, "%d:%s", Type, str.c_str());
	if (!buf) {
		throw(LogException("LogMQ::Log Malloc Failed"));
	}

	if (mq_send(m_id, buf, len, 0) < 0) {
		std::stringstream ss;
		ss << "LogMQ::Log failed to write to queue: " << m_QName << "' error: " << strerror(errno);
		free(buf);
		throw(LogException(ss.str()));
	}

	free(buf);
}